

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sais.hxx
# Opt level: O3

int saisxx_private::
    computeBWT<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,int*,int>
              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> T,
              __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> SA,int *C,int *B,
              int n,int k)

{
  uint uVar1;
  bool bVar2;
  uint *puVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  
  uVar8 = (ulong)(uint)k;
  if (C == B) {
    if (0 < k) {
      memset(C,0,uVar8 * 4);
    }
    if (0 < n) {
      uVar5 = 0;
      do {
        C[T._M_current[uVar5]] = C[T._M_current[uVar5]] + 1;
        uVar5 = uVar5 + 1;
      } while ((uint)n != uVar5);
    }
  }
  if (0 < k) {
    uVar5 = 0;
    iVar4 = 0;
    do {
      iVar10 = C[uVar5];
      B[uVar5] = iVar4;
      uVar5 = uVar5 + 1;
      iVar4 = iVar10 + iVar4;
    } while (uVar8 != uVar5);
  }
  uVar1 = n - 1;
  uVar5 = (ulong)T._M_current[(long)n + -1];
  puVar3 = (uint *)(SA._M_current + B[uVar5]);
  if (n < 2) {
    *puVar3 = uVar1;
    if (n != 1) {
      bVar2 = false;
      goto LAB_0016897d;
    }
  }
  else {
    uVar11 = -n;
    if (T._M_current[(long)n + -1] <= T._M_current[(ulong)(uint)n - 2]) {
      uVar11 = uVar1;
    }
    *puVar3 = uVar11;
  }
  puVar3 = puVar3 + 1;
  uVar7 = 0;
  do {
    uVar11 = SA._M_current[uVar7];
    if ((long)(int)uVar11 < 1) {
      if (uVar11 != 0) {
        SA._M_current[uVar7] = ~uVar11;
      }
      uVar5 = uVar5 & 0xffffffff;
    }
    else {
      uVar9 = T._M_current[uVar11 - 1];
      SA._M_current[uVar7] = ~uVar9;
      if (uVar9 == (uint)uVar5) {
        uVar5 = uVar5 & 0xffffffff;
      }
      else {
        B[(int)(uint)uVar5] = (int)((ulong)((long)puVar3 - (long)SA._M_current) >> 2);
        puVar3 = (uint *)(SA._M_current + B[(int)uVar9]);
        uVar5 = (ulong)uVar9;
      }
      uVar9 = 0;
      if ((uVar11 != 1) && (uVar9 = uVar11 - 1, T._M_current[(long)(int)uVar11 + -2] < (int)uVar5))
      {
        uVar9 = -uVar11;
      }
      *puVar3 = uVar9;
      puVar3 = puVar3 + 1;
    }
    uVar7 = uVar7 + 1;
  } while ((uint)n != uVar7);
  bVar2 = true;
LAB_0016897d:
  if (C == B) {
    if (0 < k) {
      memset(C,0,uVar8 * 4);
    }
    if (bVar2) {
      uVar5 = 0;
      do {
        C[T._M_current[uVar5]] = C[T._M_current[uVar5]] + 1;
        uVar5 = uVar5 + 1;
      } while ((uint)n != uVar5);
    }
  }
  if (0 < k) {
    uVar5 = 0;
    iVar4 = 0;
    do {
      iVar4 = iVar4 + C[uVar5];
      B[uVar5] = iVar4;
      uVar5 = uVar5 + 1;
    } while (uVar8 != uVar5);
  }
  iVar4 = -1;
  if (bVar2) {
    piVar6 = SA._M_current + *B;
    iVar10 = 0;
    uVar5 = 0xffffffff;
    uVar8 = (ulong)uVar1;
    do {
      uVar1 = SA._M_current[uVar8];
      if ((long)(int)uVar1 < 1) {
        if (uVar1 == 0) {
          uVar5 = uVar8 & 0xffffffff;
        }
        else {
          SA._M_current[uVar8] = ~uVar1;
        }
      }
      else {
        iVar4 = T._M_current[uVar1 - 1];
        SA._M_current[uVar8] = iVar4;
        if (iVar4 != iVar10) {
          B[iVar10] = (int)((ulong)((long)piVar6 - (long)SA._M_current) >> 2);
          piVar6 = SA._M_current + B[iVar4];
          iVar10 = iVar4;
        }
        uVar11 = 0;
        if ((uVar1 != 1) && (uVar11 = uVar1 - 1, iVar10 < T._M_current[(long)(int)uVar1 + -2])) {
          uVar11 = ~T._M_current[(long)(int)uVar1 + -2];
        }
        piVar6[-1] = uVar11;
        piVar6 = piVar6 + -1;
      }
      iVar4 = (int)uVar5;
      bVar2 = 0 < (long)uVar8;
      uVar8 = uVar8 - 1;
    } while (bVar2);
  }
  return iVar4;
}

Assistant:

int
computeBWT(string_type T, sarray_type SA, bucket_type C, bucket_type B,
           index_type n, index_type k) {
typedef typename std::iterator_traits<string_type>::value_type char_type;
  sarray_type b;
  index_type i, j, pidx = -1;
  char_type c0, c1;
  /* compute SAl */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, false); /* find starts of buckets */
  b = SA + B[c1 = T[j = n - 1]];
  *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
  for(i = 0; i < n; ++i) {
    if(0 < (j = SA[i])) {
      SA[i] = ~(c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *b++ = ((0 < j) && (T[j - 1] < c1)) ? ~j : j;
    } else if(j != 0) {
      SA[i] = ~j;
    }
  }
  /* compute SAs */
  if(C == B) { getCounts(T, C, n, k); }
  getBuckets(C, B, k, true); /* find ends of buckets */
  for(i = n - 1, b = SA + B[c1 = 0]; 0 <= i; --i) {
    if(0 < (j = SA[i])) {
      SA[i] = (c0 = T[--j]);
      if(c0 != c1) { B[c1] = b - SA; b = SA + B[c1 = c0]; }
      *--b = ((0 < j) && (T[j - 1] > c1)) ? ~((index_type)T[j - 1]) : j;
    } else if(j != 0) {
      SA[i] = ~j;
    } else {
      pidx = i;
    }
  }
  return pidx;
}